

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::emplaceGlobalInitInst<mocker::ir::Call,std::__cxx11::string&>
          (BuilderContext *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  FuncsMap *this_00;
  mapped_type *this_01;
  BasicBlockList *this_02;
  reference this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  key_type local_40;
  mapped_type *local_20;
  mapped_type *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  BuilderContext *this_local;
  
  func = (mapped_type *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = Module::getFuncs_abi_cxx11_(&this->module);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"_init_global_vars",&local_41);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
            ::at(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = this_01;
  this_02 = FunctionModule::getMutableBBs_abi_cxx11_(this_01);
  this_03 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
            back(this_02);
  std::make_shared<mocker::ir::Call,std::__cxx11::string&>(&local_78);
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Call,void>
            ((shared_ptr<mocker::ir::IRInst> *)&local_78.field_2,
             (shared_ptr<mocker::ir::Call> *)&local_78);
  BasicBlock::appendInst(this_03,(shared_ptr<mocker::ir::IRInst> *)&local_78.field_2);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
            ((shared_ptr<mocker::ir::IRInst> *)&local_78.field_2);
  std::shared_ptr<mocker::ir::Call>::~shared_ptr((shared_ptr<mocker::ir::Call> *)&local_78);
  return;
}

Assistant:

void emplaceGlobalInitInst(Args &&... args) {
    auto &func = module.getFuncs().at("_init_global_vars");
    func.getMutableBBs().back().appendInst(
        std::make_shared<Inst>(std::forward<Args>(args)...));
  }